

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteFloat
               (int field_number,float value,CodedOutputStream *output)

{
  CodedOutputStream *in_RSI;
  int in_EDI;
  float in_XMM0_Da;
  uint32 in_stack_ffffffffffffffbc;
  CodedOutputStream *pCVar1;
  CodedOutputStream *this;
  
  pCVar1 = in_RSI;
  MakeTag(in_EDI,WIRETYPE_FIXED32);
  io::CodedOutputStream::WriteTag(in_RSI,in_stack_ffffffffffffffbc);
  this = pCVar1;
  EncodeFloat(in_XMM0_Da);
  io::CodedOutputStream::WriteLittleEndian32(this,(uint32)((ulong)pCVar1 >> 0x20));
  return;
}

Assistant:

void WireFormatLite::WriteFloat(int field_number, float value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED32, output);
  WriteFloatNoTag(value, output);
}